

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

xml_parse_result * __thiscall
NULLCPugiXML::xml_document__load
          (NULLCPugiXML *this,NULLCArray contents,uint options,xml_document *document)

{
  undefined4 in_register_0000000c;
  xml_parse_result local_60;
  xml_parse_result *local_48;
  xml_parse_result *res;
  xml_document *doc;
  xml_document *document_local;
  uint options_local;
  undefined4 local_24;
  NULLCPugiXML *local_1c;
  NULLCArray contents_local;
  
  doc = (xml_document *)CONCAT44(in_register_0000000c,options);
  document_local._0_4_ = contents.len;
  local_24 = contents.ptr._0_4_;
  unique0x1000011b = this;
  local_1c = this;
  contents_local.ptr._0_4_ = local_24;
  if ((doc->super_xml_node)._root == (xml_node_struct *)0x0) {
    nullcThrowError("xml_document constructor wasn\'t called");
    contents_local._4_8_ = 0;
  }
  else {
    res = (xml_parse_result *)((doc->super_xml_node)._root)->header;
    if (res == (xml_parse_result *)0x0) {
      res = (xml_parse_result *)nullcAllocate(0xd0);
      ((doc->super_xml_node)._root)->header = (uintptr_t)res;
      pugi::xml_document::xml_document((xml_document *)res);
    }
    local_48 = (xml_parse_result *)nullcAllocate(0xc);
    pugi::xml_document::load_string
              (&local_60,(xml_document *)res,(char_t *)local_1c,(uint)document_local);
    xml_parse_result::operator=(local_48,&local_60);
    contents_local._4_8_ = local_48;
  }
  return (xml_parse_result *)contents_local._4_8_;
}

Assistant:

xml_parse_result* xml_document__load(NULLCArray contents, unsigned int options, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return NULL; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			doc = document->impl->document = (pugi::xml_document*)nullcAllocate(sizeof(pugi::xml_document));
			::new(doc) pugi::xml_document();
		}
		xml_parse_result *res = (xml_parse_result*)nullcAllocate(sizeof(xml_parse_result));
		*res = doc->load_string(contents.ptr, options);
		return res;
	}